

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

VP8StatusCode WebPIAppend(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  size_t *psVar1;
  DecState DVar2;
  MemBufferMode MVar3;
  void *pvVar4;
  VP8StatusCode VVar5;
  VP8Decoder *dec;
  uint8_t *__dest;
  uint8_t *puVar6;
  uint8_t *__src;
  ulong nmemb;
  size_t __n;
  bool bVar7;
  
  VVar5 = VP8_STATUS_INVALID_PARAM;
  if (data != (uint8_t *)0x0 && idec != (WebPIDecoder *)0x0) {
    DVar2 = idec->state_;
    VVar5 = VP8_STATUS_BITSTREAM_ERROR;
    if (DVar2 != STATE_ERROR) {
      VVar5 = (uint)(DVar2 != STATE_DONE) * 5;
    }
    if (VVar5 == VP8_STATUS_SUSPENDED) {
      MVar3 = (idec->mem_).mode_;
      if (MVar3 != MEM_MODE_APPEND) {
        if (MVar3 != MEM_MODE_NONE) {
          return VP8_STATUS_INVALID_PARAM;
        }
        (idec->mem_).mode_ = MEM_MODE_APPEND;
      }
      pvVar4 = idec->dec_;
      bVar7 = true;
      if (((DVar2 != STATE_WEBP_HEADER) && (idec->is_lossless_ == 0)) &&
         (*(long *)((long)pvVar4 + 0xb98) != 0)) {
        bVar7 = *(int *)((long)pvVar4 + 0xba8) != 0;
      }
      __dest = (idec->mem_).buf_;
      if (__dest == (uint8_t *)0x0) {
        puVar6 = (uint8_t *)0x0;
      }
      else {
        puVar6 = __dest + (idec->mem_).start_;
      }
      __src = puVar6;
      if (!bVar7) {
        __src = *(uint8_t **)((long)pvVar4 + 0xb98);
      }
      VVar5 = VP8_STATUS_OUT_OF_MEMORY;
      if (data_size < 0xfffffff7) {
        __n = (idec->mem_).end_;
        if ((idec->mem_).buf_size_ < data_size + __n) {
          __n = (__n - (idec->mem_).start_) + ((long)puVar6 - (long)__src);
          nmemb = data_size + __n + 0xfff & 0xfffffffffffff000;
          __dest = (uint8_t *)WebPSafeMalloc(nmemb,1);
          if (__dest == (uint8_t *)0x0) {
            return VP8_STATUS_OUT_OF_MEMORY;
          }
          if (__src != (uint8_t *)0x0) {
            memcpy(__dest,__src,__n);
          }
          WebPSafeFree((idec->mem_).buf_);
          (idec->mem_).buf_ = __dest;
          (idec->mem_).buf_size_ = nmemb;
          (idec->mem_).start_ = (long)puVar6 - (long)__src;
          (idec->mem_).end_ = __n;
        }
        memcpy(__dest + __n,data,data_size);
        psVar1 = &(idec->mem_).end_;
        *psVar1 = *psVar1 + data_size;
        DoRemap(idec,(ptrdiff_t)((idec->mem_).buf_ + ((idec->mem_).start_ - (long)puVar6)));
        VVar5 = IDecode(idec);
        return VVar5;
      }
    }
  }
  return VVar5;
}

Assistant:

VP8StatusCode WebPIAppend(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem_, MEM_MODE_APPEND)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Append data to memory buffer
  if (!AppendToMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_OUT_OF_MEMORY;
  }
  return IDecode(idec);
}